

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::~Builder(Builder *this)

{
  Builder *this_local;
  
  std::
  set<std::pair<unsigned_long,_unsigned_long>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~set(&this->string_pool);
  std::set<unsigned_long,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>::
  ~set(&this->key_pool);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::~vector
            (&this->stack_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->buf_);
  return;
}

Assistant:

class Builder FLATBUFFERS_FINAL_CLASS {
 public:
  Builder(size_t initial_size = 256,
          BuilderFlag flags = BUILDER_FLAG_SHARE_KEYS)
      : buf_(initial_size),
        finished_(false),
        has_duplicate_keys_(false),
        flags_(flags),
        force_min_bit_width_(BIT_WIDTH_8),
        key_pool(KeyOffsetCompare(buf_)),
        string_pool(StringOffsetCompare(buf_)) {
    buf_.clear();
  }